

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::MetaVariable::get_value<int>(MetaVariable *this,int *dst)

{
  int *piVar1;
  bool bVar2;
  
  if (dst == (int *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    piVar1 = tinyusdz::value::Value::as<int>(&this->_value,false);
    if (piVar1 != (int *)0x0) {
      *dst = *piVar1;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool get_value(T *dst) const {
    if (!dst) {
      return false;
    }

    if (const T *v = _value.as<T>()) {
      (*dst) = *v;
      return true;
    }

    return false;
  }